

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O2

void fillMath(ElementType a,ElementType b,ElementType c,ElementType d,ElementType e,ElementType f,
             Storage3D *field,int64_t domain_size,int64_t domain_height)

{
  int64_t k;
  long lVar1;
  long lVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  dVar8 = 1.0 / (double)(domain_size + halo_width * 2);
  lVar2 = -halo_width;
  lVar1 = halo_width;
  if (domain_height < 1) {
    domain_height = 0;
  }
  for (; lVar2 < lVar1 + domain_size; lVar2 = lVar2 + 1) {
    dVar4 = (double)lVar2 * dVar8;
    lVar3 = -lVar1;
    for (; lVar3 < lVar1 + domain_size; lVar3 = lVar3 + 1) {
      dVar5 = (double)lVar3 * dVar8;
      for (lVar1 = 0; domain_height != lVar1; lVar1 = lVar1 + 1) {
        dVar6 = cos(pi * (dVar4 * 1.5 + dVar5));
        dVar7 = sin(pi * c * (dVar5 + dVar4 + dVar4));
        field->alignedPtr
        [field->offset +
         (field->strides)._M_elems[2] * lVar3 +
         (field->strides)._M_elems[1] * lVar2 + (field->strides)._M_elems[0] * lVar1] =
             (double)lVar1 * 0.01 + ((dVar7 + dVar6 + b) * a) / d;
      }
      lVar1 = halo_width;
    }
  }
  return;
}

Assistant:

void fillMath(ElementType a, ElementType b, ElementType c, ElementType d,
              ElementType e, ElementType f, Storage3D &field, const int64_t domain_size, const int64_t domain_height) {
  ElementType dx = ElementType(1.0) / (ElementType) (domain_size + 2*halo_width);
  ElementType dy = ElementType(1.0) / (ElementType) (domain_size + 2*halo_width);

  for (int64_t j = -halo_width; j < domain_size + halo_width; j++) {
    for (int64_t i = -halo_width; i < domain_size + halo_width; i++) {
      ElementType x = dx * (ElementType) i;
      ElementType y = dy * (ElementType) j;
      for (int64_t k = 0; k < domain_height; k++) {
          field(i, j, k) = k*ElementType(10e-3) + a*(b + cos(pi*(x + c*y)) + sin(d*pi*(x + e*y)))/f;
      }
    }
  }
}